

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAgglomerateEl.h
# Opt level: O2

REAL __thiscall TPZAgglomerateElement::InnerRadius(TPZAgglomerateElement *this)

{
  TPZCompEl *pTVar1;
  long *plVar2;
  long lVar3;
  long sub;
  double dVar4;
  double dVar5;
  double local_40;
  
  lVar3 = (this->fIndexes).super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
  sub = 0;
  if (lVar3 < 1) {
    lVar3 = sub;
  }
  local_40 = 0.0;
  for (; lVar3 != sub; sub = sub + 1) {
    pTVar1 = SubElement(this,sub);
    plVar2 = (long *)__dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZCompElDisc::typeinfo,0);
    dVar4 = (double)(**(code **)(*plVar2 + 0x2d0))(plVar2);
    dVar5 = (double)(**(code **)(*plVar2 + 0x60))(plVar2);
    local_40 = local_40 + dVar5 * dVar4;
  }
  dVar4 = (double)(**(code **)(*(long *)&(this->super_TPZCompElDisc).super_TPZInterpolationSpace.
                                         super_TPZCompEl + 0x60))(this);
  return local_40 / dVar4;
}

Assistant:

REAL InnerRadius() override {
		int64_t nsubel = this->NIndexes();
		REAL value = 0.;
		TPZCompElDisc * disc;
		for (int64_t i = 0; i < nsubel; i++){
			disc = dynamic_cast<TPZCompElDisc *>(this->SubElement(i) );
#ifdef PZDEBUG
			if (!disc) {
				PZError << "TPZAgglomerateElement::InnerRadius FineElement must be a TPZCompElDisc" << std::endl;
				exit (-1);
			}
#endif
			value += disc->InnerRadius() * disc->VolumeOfEl();
		}
		value = value / this->VolumeOfEl();
		return value;  
	}